

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.cpp
# Opt level: O2

int GetNumAlphaCharsInString(string *my_str)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int i;
  ulong uVar4;
  
  iVar3 = 0;
  for (uVar4 = 0; uVar4 < my_str->_M_string_length; uVar4 = uVar4 + 1) {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)my_str);
    iVar1 = isalpha((int)*pcVar2);
    iVar3 = (iVar3 + 1) - (uint)(iVar1 == 0);
  }
  return iVar3;
}

Assistant:

int GetNumAlphaCharsInString(string *my_str)
{
    //Use is alpha function to find alpha chars.
    int alphaCount = 0;

    for(int i = 0; i < my_str->length(); i++)
    {

        if(isalpha(my_str->at(i)))
        {
            alphaCount++;
        }
    }

    return alphaCount;
}